

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cloud.c
# Opt level: O2

REF_STATUS ref_cloud_deep_copy(REF_CLOUD *ref_cloud_ptr,REF_CLOUD original)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  REF_CLOUD pRVar4;
  REF_GLOB *pRVar5;
  REF_DBL *pRVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  REF_GLOB RVar13;
  ulong uVar14;
  bool bVar15;
  undefined8 uStack_40;
  
  pRVar4 = (REF_CLOUD)malloc(0x20);
  *ref_cloud_ptr = pRVar4;
  if (pRVar4 == (REF_CLOUD)0x0) {
    pcVar10 = "malloc *ref_cloud_ptr of REF_CLOUD_STRUCT NULL";
    uStack_40 = 0x3b;
  }
  else {
    uVar1 = original->n;
    pRVar4->n = uVar1;
    iVar2 = original->max;
    pRVar4->max = iVar2;
    uVar3 = original->naux;
    pRVar4->naux = uVar3;
    if ((long)iVar2 < 0) {
      pcVar10 = "malloc ref_cloud->global of REF_GLOB negative";
      uStack_40 = 0x43;
LAB_001d12e1:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",
             uStack_40,"ref_cloud_deep_copy",pcVar10);
      return 1;
    }
    pRVar5 = (REF_GLOB *)malloc((long)iVar2 * 8);
    pRVar4->global = pRVar5;
    if (pRVar5 == (REF_GLOB *)0x0) {
      pcVar10 = "malloc ref_cloud->global of REF_GLOB NULL";
      uStack_40 = 0x43;
    }
    else {
      if ((int)(iVar2 * uVar3) < 0) {
        pcVar10 = "malloc ref_cloud->aux of REF_DBL negative";
        uStack_40 = 0x45;
        goto LAB_001d12e1;
      }
      pRVar6 = (REF_DBL *)malloc((ulong)(iVar2 * uVar3) << 3);
      pRVar4->aux = pRVar6;
      if (pRVar6 != (REF_DBL *)0x0) {
        RVar13 = -1;
        if (0 < (int)uVar1) {
          RVar13 = *original->global;
        }
        uVar7 = 0;
        if (0 < (int)uVar3) {
          uVar7 = (ulong)uVar3;
        }
        uVar8 = 0;
        if (0 < (int)uVar1) {
          uVar8 = (ulong)uVar1;
        }
        lVar9 = 0;
        uVar11 = 0;
        while (uVar11 != uVar8) {
          pRVar5[uVar11] = RVar13;
          lVar12 = lVar9;
          uVar14 = uVar7;
          while (bVar15 = uVar14 != 0, uVar14 = uVar14 - 1, bVar15) {
            *(undefined8 *)((long)pRVar6 + lVar12) = *(undefined8 *)((long)original->aux + lVar12);
            lVar12 = lVar12 + 8;
          }
          uVar11 = uVar11 + 1;
          RVar13 = -1;
          if ((long)uVar11 < (long)(int)uVar1) {
            RVar13 = original->global[uVar11];
          }
          lVar9 = lVar9 + (long)(int)uVar3 * 8;
        }
        return 0;
      }
      pcVar10 = "malloc ref_cloud->aux of REF_DBL NULL";
      uStack_40 = 0x45;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",uStack_40
         ,"ref_cloud_deep_copy",pcVar10);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_cloud_deep_copy(REF_CLOUD *ref_cloud_ptr,
                                       REF_CLOUD original) {
  REF_CLOUD ref_cloud;
  REF_INT item, i;
  REF_GLOB global;

  ref_malloc(*ref_cloud_ptr, 1, REF_CLOUD_STRUCT);

  ref_cloud = (*ref_cloud_ptr);

  ref_cloud_n(ref_cloud) = ref_cloud_n(original);
  ref_cloud_max(ref_cloud) = ref_cloud_max(original);
  ref_cloud_naux(ref_cloud) = ref_cloud_naux(original);

  ref_malloc(ref_cloud->global, ref_cloud_max(ref_cloud), REF_GLOB);
  ref_malloc(ref_cloud->aux,
             ref_cloud_naux(ref_cloud) * ref_cloud_max(ref_cloud), REF_DBL);

  each_ref_cloud_global(original, item, global) {
    ref_cloud_global(ref_cloud, item) = global;
    each_ref_cloud_aux(ref_cloud, i) {
      ref_cloud_aux(ref_cloud, i, item) = ref_cloud_aux(original, i, item);
    }
  }

  return REF_SUCCESS;
}